

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::DebugDocument>
               (AllocatorType *allocator,DebugDocument *obj)

{
  Js::DebugDocument::~DebugDocument(obj);
  HeapAllocator::Free(allocator,obj,0x20);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj)
{
    obj->~T();

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(
        (void*)obj, _AllocatorDelete<T, deleteFlags>::Size());
}